

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * safemalloc(size_t factor1,size_t factor2,size_t addend)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  void *p;
  size_t size;
  size_t product;
  size_t addend_local;
  size_t factor2_local;
  size_t factor1_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = factor2;
  if ((factor1 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0)) &&
     (factor1 * factor2 <= -addend - 1)) {
    p = (void *)(factor1 * factor2 + addend);
    if (p == (void *)0x0) {
      p = (void *)0x1;
    }
    pvVar2 = malloc((size_t)p);
    if (pvVar2 != (void *)0x0) {
      return pvVar2;
    }
  }
  out_of_memory();
}

Assistant:

void *safemalloc(size_t factor1, size_t factor2, size_t addend)
{
    if (factor1 > SIZE_MAX / factor2)
        goto fail;
    size_t product = factor1 * factor2;

    if (addend > SIZE_MAX)
        goto fail;
    if (product > SIZE_MAX - addend)
        goto fail;
    size_t size = product + addend;

    if (size == 0)
        size = 1;

    void *p;
#ifdef MINEFIELD
    p = minefield_c_malloc(size);
#else
    p = malloc(size);
#endif

    if (!p)
        goto fail;

    return p;

  fail:
    out_of_memory();
}